

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitArrayLen
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,ArrayLen *curr)

{
  bool bVar1;
  ExpressionRunner<wasm::ModuleRunner> *this_00;
  element_type *peVar2;
  size_t sVar3;
  Literal local_a0;
  shared_ptr<wasm::GCData> data;
  undefined1 local_68 [8];
  Flow ref;
  ArrayLen *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  ref.breakTo.super_IString.str._M_str = (char *)curr;
  this_00 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  visit((Flow *)local_68,this_00,*(Expression **)(ref.breakTo.super_IString.str._M_str + 0x10));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1;
  }
  else {
    Flow::getSingleValue((Flow *)local_68);
    wasm::Literal::getGCData((Literal *)&stack0xffffffffffffff78);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffff78);
    if (!bVar1) {
      (*this->_vptr_ExpressionRunner[2])(this,"null ref");
    }
    peVar2 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&stack0xffffffffffffff78);
    sVar3 = SmallVector<wasm::Literal,_1UL>::size
                      (&(peVar2->values).super_SmallVector<wasm::Literal,_1UL>);
    wasm::Literal::Literal(&local_a0,(int32_t)sVar3);
    Flow::Flow(__return_storage_ptr__,&local_a0);
    wasm::Literal::~Literal(&local_a0);
    data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1;
    std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)&stack0xffffffffffffff78)
    ;
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayLen(ArrayLen* curr) {
    NOTE_ENTER("ArrayLen");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    return Literal(int32_t(data->values.size()));
  }